

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void FunctionalTester<unsigned_short,_void>::Test(void)

{
  unsigned_short x;
  pointer pvVar1;
  pointer str2;
  unsigned_short *arg;
  undefined1 local_9c [8];
  buf_t buf2;
  unsigned_short local_50 [3];
  undefined1 local_49;
  unsigned_short i;
  unsigned_short imax;
  unsigned_short imin;
  buf_t buf1;
  TestWatcher<unsigned_short> tw;
  
  TestWatcher<unsigned_short>::TestWatcher((TestWatcher<unsigned_short> *)(buf1._M_elems + 0x38));
  local_50[2] = 0;
  local_50[1] = 0xffff;
  for (local_50[0] = 0; x = local_50[0], local_50[0] != 0xffff; local_50[0] = local_50[0] + 1) {
    pvVar1 = std::array<char,_64UL>::data((array<char,_64UL> *)&local_49);
    int2str::convert_with_zero<unsigned_short,char*>(x,pvVar1);
    boost::lexical_cast<std::array<char,64ul>,unsigned_short>
              ((array<char,_64UL> *)local_9c,(boost *)local_50,arg);
    pvVar1 = std::array<char,_64UL>::data((array<char,_64UL> *)&local_49);
    str2 = std::array<char,_64UL>::data((array<char,_64UL> *)local_9c);
    StrcmpAndExit(pvVar1,str2);
  }
  TestWatcher<unsigned_short>::~TestWatcher((TestWatcher<unsigned_short> *)(buf1._M_elems + 0x38));
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }